

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error storeAtts(XML_Parser parser,ENCODING *enc,char *attStr,TAG_NAME *tagNamePtr,
                   BINDING **bindingsPtr)

{
  undefined8 *puVar1;
  STRING_POOL *pool;
  long lVar2;
  char cVar3;
  undefined1 uVar4;
  long lVar5;
  DEFAULT_ATTRIBUTE *pDVar6;
  undefined1 *puVar7;
  char *pcVar8;
  XML_Char *pXVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  XML_Error XVar13;
  int iVar14;
  int iVar15;
  ATTRIBUTE *pAVar16;
  ATTRIBUTE_ID *pAVar17;
  NAMED *pNVar18;
  BINDING *pBVar19;
  XML_Char *pXVar20;
  long *plVar21;
  XML_Error XVar22;
  undefined8 *puVar23;
  undefined8 uVar24;
  undefined8 *puVar25;
  ulong uVar26;
  long lVar27;
  char *pcVar28;
  BINDING *b;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  XML_Error local_94;
  int local_7c;
  ELEMENT_TYPE *local_70;
  
  if (tagNamePtr == (TAG_NAME *)0x0) {
    uVar26 = 0;
    local_70 = (ELEMENT_TYPE *)0x0;
  }
  else {
    local_70 = (ELEMENT_TYPE *)lookup((HASH_TABLE *)((long)parser + 0x2b8),tagNamePtr->str,0);
    if (local_70 == (ELEMENT_TYPE *)0x0) {
      pXVar20 = poolCopyString((STRING_POOL *)((long)parser + 0x330),tagNamePtr->str);
      tagNamePtr->str = pXVar20;
      if (pXVar20 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      local_70 = (ELEMENT_TYPE *)lookup((HASH_TABLE *)((long)parser + 0x2b8),pXVar20,0x28);
      if (local_70 == (ELEMENT_TYPE *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      if ((*(int *)((long)parser + 0x1c8) != 0) &&
         (iVar12 = setElementTypePrefix(parser,local_70), iVar12 == 0)) {
        return XML_ERROR_NO_MEMORY;
      }
    }
    uVar26 = (ulong)(uint)local_70->nDefaultAtts;
  }
  uVar10 = (*enc->getAtts)(enc,attStr,*(int *)((long)parser + 0x3f0),
                           *(ATTRIBUTE **)((long)parser + 0x400));
  iVar15 = (int)uVar26;
  iVar11 = iVar15 + uVar10;
  iVar12 = *(int *)((long)parser + 0x3f0);
  if (iVar12 < iVar11) {
    *(int *)((long)parser + 0x3f0) = iVar11 + 0x10;
    pAVar16 = (ATTRIBUTE *)
              (**(code **)((long)parser + 0x20))
                        (*(undefined8 *)((long)parser + 0x400),(long)iVar11 * 0x20 + 0x200);
    *(ATTRIBUTE **)((long)parser + 0x400) = pAVar16;
    if (pAVar16 == (ATTRIBUTE *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    if (iVar12 < (int)uVar10) {
      (*enc->getAtts)(enc,attStr,uVar10,pAVar16);
    }
  }
  lVar5 = *(long *)((long)parser + 0x400);
  if ((int)uVar10 < 1) {
    local_94 = XML_ERROR_NO_MEMORY;
    local_7c = 0;
    iVar12 = 0;
  }
  else {
    puVar1 = (undefined8 *)((long)parser + 0x438);
    uVar29 = 0;
    local_94 = XML_ERROR_NO_MEMORY;
    local_7c = 0;
    iVar11 = 0;
    do {
      lVar27 = uVar29 * 0x20;
      pcVar28 = *(char **)(*(long *)((long)parser + 0x400) + lVar27);
      iVar12 = (*enc->nameLength)(enc,pcVar28);
      pAVar17 = getAttributeId(parser,enc,pcVar28,pcVar28 + iVar12);
      iVar12 = iVar11;
      if (pAVar17 == (ATTRIBUTE_ID *)0x0) {
LAB_004d91b7:
        bVar30 = false;
        local_94 = XML_ERROR_NO_MEMORY;
      }
      else if (pAVar17->name[-1] == '\0') {
        pAVar17->name[-1] = '\x01';
        iVar12 = iVar11 + 1;
        *(XML_Char **)(lVar5 + (long)iVar11 * 8) = pAVar17->name;
        lVar2 = *(long *)((long)parser + 0x400) + lVar27;
        if (*(char *)(*(long *)((long)parser + 0x400) + 0x18 + lVar27) == '\0') {
          iVar14 = 1;
          if ((pAVar17->maybeTokenized != '\0') && (0 < iVar15)) {
            lVar27 = 0;
            do {
              if (pAVar17 == *(ATTRIBUTE_ID **)((long)&local_70->defaultAtts->id + lVar27)) {
                iVar14 = (int)(&local_70->defaultAtts->isCdata)[lVar27];
                break;
              }
              lVar27 = lVar27 + 0x18;
            } while (uVar26 * 0x18 != lVar27);
          }
          XVar13 = storeAttributeValue(parser,enc,iVar14,*(char **)(lVar2 + 8),
                                       *(char **)(lVar2 + 0x10),
                                       (STRING_POOL *)((long)parser + 0x418));
          XVar22 = XVar13;
          if (XVar13 == XML_ERROR_NONE) {
            puVar23 = puVar1;
            puVar25 = (undefined8 *)((long)parser + 0x430);
            if (tagNamePtr != (TAG_NAME *)0x0) {
              *(undefined8 *)(lVar5 + (long)iVar12 * 8) = *puVar1;
              puVar23 = (undefined8 *)((long)parser + 0x430);
              puVar25 = puVar1;
            }
            *puVar25 = *puVar23;
            XVar22 = local_94;
          }
          local_94 = XVar22;
          if (XVar13 != XML_ERROR_NONE) {
            bVar30 = false;
            goto LAB_004d934c;
          }
        }
        else if (tagNamePtr != (TAG_NAME *)0x0) {
          pXVar20 = poolStoreString((STRING_POOL *)((long)parser + 0x418),enc,*(char **)(lVar2 + 8),
                                    *(char **)(lVar2 + 0x10));
          *(XML_Char **)(lVar5 + (long)iVar12 * 8) = pXVar20;
          if (pXVar20 == (XML_Char *)0x0) goto LAB_004d91b7;
          *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
        }
        if ((tagNamePtr == (TAG_NAME *)0x0) || (pAVar17->prefix == (PREFIX *)0x0)) {
          iVar11 = iVar11 + 2;
        }
        else if (pAVar17->xmlns == '\0') {
          local_7c = local_7c + 1;
          pAVar17->name[-1] = '\x02';
          iVar11 = iVar11 + 2;
        }
        else {
          iVar14 = addBinding(parser,pAVar17->prefix,pAVar17,
                              *(XML_Char **)(lVar5 + (long)iVar12 * 8),bindingsPtr);
          if (iVar14 == 0) goto LAB_004d91b7;
        }
        iVar12 = iVar11;
        bVar30 = true;
      }
      else {
        local_94 = XML_ERROR_DUPLICATE_ATTRIBUTE;
        if (*(ENCODING **)((long)parser + 0x118) == enc) {
          *(undefined8 *)((long)parser + 0x218) =
               *(undefined8 *)(*(long *)((long)parser + 0x400) + lVar27);
        }
        bVar30 = false;
      }
LAB_004d934c:
      if (!bVar30) {
        return local_94;
      }
      uVar29 = uVar29 + 1;
      iVar11 = iVar12;
    } while (uVar29 != uVar10);
  }
  if (tagNamePtr != (TAG_NAME *)0x0) {
    *(int *)((long)parser + 0x3f4) = iVar12;
    lVar27 = 0xffffffff;
    if ((local_70->idAtt == (ATTRIBUTE_ID *)0x0) ||
       (pXVar20 = local_70->idAtt->name, pXVar20[-1] == '\0')) {
LAB_004d9475:
      *(int *)((long)parser + 0x3f8) = (int)lVar27;
    }
    else if (0 < iVar12) {
      lVar27 = 0;
      do {
        if (*(XML_Char **)(lVar5 + lVar27 * 8) == pXVar20) goto LAB_004d9475;
        lVar27 = lVar27 + 2;
      } while ((int)lVar27 < iVar12);
    }
    bVar30 = 0 < iVar15;
    if (0 < iVar15) {
      lVar27 = 0x10;
      uVar29 = 1;
      do {
        pDVar6 = local_70->defaultAtts;
        pAVar17 = *(ATTRIBUTE_ID **)((long)pDVar6 + lVar27 + -0x10);
        pXVar20 = pAVar17->name;
        bVar31 = true;
        if ((pXVar20[-1] == '\0') &&
           (pXVar9 = *(XML_Char **)((long)&pDVar6->id + lVar27), pXVar9 != (XML_Char *)0x0)) {
          if (pAVar17->prefix == (PREFIX *)0x0) {
            pXVar20[-1] = '\x01';
            *(undefined8 *)(lVar5 + (long)iVar12 * 8) =
                 **(undefined8 **)((long)pDVar6 + lVar27 + -0x10);
            uVar24 = *(undefined8 *)((long)&pDVar6->id + lVar27);
          }
          else {
            if (pAVar17->xmlns != '\0') {
              iVar15 = addBinding(parser,pAVar17->prefix,pAVar17,pXVar9,bindingsPtr);
              bVar31 = iVar15 != 0;
              if (!bVar31) {
                local_94 = XML_ERROR_NO_MEMORY;
              }
              goto LAB_004d94b5;
            }
            pXVar20[-1] = '\x02';
            local_7c = local_7c + 1;
            *(undefined8 *)(lVar5 + (long)iVar12 * 8) =
                 **(undefined8 **)((long)pDVar6 + lVar27 + -0x10);
            uVar24 = *(undefined8 *)((long)&pDVar6->id + lVar27);
          }
          *(undefined8 *)(lVar5 + 8 + (long)iVar12 * 8) = uVar24;
          iVar12 = iVar12 + 2;
        }
LAB_004d94b5:
        if (!bVar31) goto LAB_004d959b;
        bVar30 = uVar29 < uVar26;
        lVar27 = lVar27 + 0x18;
        bVar31 = uVar29 != uVar26;
        uVar29 = uVar29 + 1;
      } while (bVar31);
    }
    *(undefined8 *)(lVar5 + (long)iVar12 * 8) = 0;
LAB_004d959b:
    if (bVar30) {
      return local_94;
    }
  }
  uVar26 = 0;
  if ((local_7c == 0) || (iVar12 < 1)) {
LAB_004d977b:
    if ((int)uVar26 < iVar12) {
      plVar21 = (long *)(lVar5 + (uVar26 & 0xffffffff) * 8);
      do {
        *(undefined1 *)(*plVar21 + -1) = 0;
        plVar21 = plVar21 + 2;
        uVar10 = (int)uVar26 + 2;
        uVar26 = (ulong)uVar10;
      } while ((int)uVar10 < iVar12);
    }
    if (tagNamePtr != (TAG_NAME *)0x0) {
      for (pBVar19 = *bindingsPtr; pBVar19 != (BINDING *)0x0; pBVar19 = pBVar19->nextTagBinding) {
        pBVar19->attId->name[-1] = '\0';
      }
      if (local_70->prefix == (PREFIX *)0x0) {
        pBVar19 = *(BINDING **)((long)parser + 0x398);
        if (pBVar19 == (BINDING *)0x0) {
          return XML_ERROR_NONE;
        }
        pcVar28 = tagNamePtr->str;
      }
      else {
        pBVar19 = local_70->prefix->binding;
        if (pBVar19 == (BINDING *)0x0) {
          return XML_ERROR_NONE;
        }
        pcVar28 = tagNamePtr->str;
        do {
          cVar3 = *pcVar28;
          pcVar28 = pcVar28 + 1;
        } while (cVar3 != ':');
      }
      tagNamePtr->localPart = pcVar28;
      iVar12 = pBVar19->uriLen;
      tagNamePtr->uriLen = iVar12;
      uVar26 = 0;
      do {
        pcVar8 = pcVar28 + uVar26;
        uVar26 = uVar26 + 1;
      } while (*pcVar8 != '\0');
      if (pBVar19->uriAlloc < iVar12 + (int)uVar26) {
        iVar12 = iVar12 + 0x18 + (int)uVar26;
        pXVar20 = (XML_Char *)(**(code **)((long)parser + 0x18))((long)iVar12);
        if (pXVar20 == (XML_Char *)0x0) {
          local_94 = XML_ERROR_NO_MEMORY;
        }
        else {
          pBVar19->uriAlloc = iVar12;
          memcpy(pXVar20,pBVar19->uri,(long)pBVar19->uriLen);
          plVar21 = *(long **)((long)parser + 0x3d0);
          if (plVar21 != (long *)0x0) {
            pXVar9 = pBVar19->uri;
            do {
              if ((XML_Char *)plVar21[3] == pXVar9) {
                plVar21[3] = (long)pXVar20;
              }
              plVar21 = (long *)*plVar21;
            } while (plVar21 != (long *)0x0);
          }
          (**(code **)((long)parser + 0x28))(pBVar19->uri);
          pBVar19->uri = pXVar20;
        }
        if (pXVar20 == (XML_Char *)0x0) {
          return local_94;
        }
      }
      memcpy(pBVar19->uri + pBVar19->uriLen,pcVar28,uVar26 & 0xffffffff);
      tagNamePtr->str = pBVar19->uri;
    }
    return XML_ERROR_NONE;
  }
  pool = (STRING_POOL *)((long)parser + 0x418);
  uVar26 = 0;
LAB_004d95d3:
  lVar27 = *(long *)(lVar5 + uVar26 * 8);
  cVar3 = *(char *)(lVar27 + -1);
  *(undefined1 *)(lVar27 + -1) = 0;
  if (cVar3 == '\x02') {
    pNVar18 = lookup((HASH_TABLE *)((long)parser + 0x2e0),*(KEY *)(lVar5 + uVar26 * 8),0);
    puVar1 = *(undefined8 **)(pNVar18[1].name + 8);
    if (puVar1 != (undefined8 *)0x0) {
      pcVar28 = *(char **)(lVar5 + uVar26 * 8);
      if (0 < *(int *)(puVar1 + 5)) {
        lVar27 = 0;
        do {
          if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
             (iVar15 = poolGrow(pool), iVar15 == 0)) goto LAB_004d9732;
          uVar4 = *(undefined1 *)(puVar1[4] + lVar27);
          puVar7 = *(undefined1 **)((long)parser + 0x430);
          *(undefined1 **)((long)parser + 0x430) = puVar7 + 1;
          *puVar7 = uVar4;
          lVar27 = lVar27 + 1;
        } while (lVar27 < *(int *)(puVar1 + 5));
      }
      do {
        cVar3 = *pcVar28;
        pcVar28 = pcVar28 + 1;
      } while (cVar3 != ':');
      do {
        if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
           (iVar15 = poolGrow(pool), iVar15 == 0)) goto LAB_004d9732;
        cVar3 = *pcVar28;
        pcVar8 = *(char **)((long)parser + 0x430);
        *(char **)((long)parser + 0x430) = pcVar8 + 1;
        *pcVar8 = cVar3;
        cVar3 = *pcVar28;
        pcVar28 = pcVar28 + 1;
      } while (cVar3 != '\0');
      if (*(int *)((long)parser + 0x1cc) != 0) {
        *(undefined1 *)(*(long *)((long)parser + 0x430) + -1) =
             *(undefined1 *)((long)parser + 0x488);
        pcVar28 = *(char **)*puVar1;
        do {
          if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
             (iVar15 = poolGrow(pool), iVar15 == 0)) goto LAB_004d9732;
          cVar3 = *pcVar28;
          pcVar8 = *(char **)((long)parser + 0x430);
          *(char **)((long)parser + 0x430) = pcVar8 + 1;
          *pcVar8 = cVar3;
          cVar3 = *pcVar28;
          pcVar28 = pcVar28 + 1;
        } while (cVar3 != '\0');
      }
      *(undefined8 *)(lVar5 + uVar26 * 8) = *(undefined8 *)((long)parser + 0x438);
      *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
      bVar30 = true;
      goto LAB_004d9741;
    }
    goto LAB_004d974f;
  }
  goto LAB_004d9764;
LAB_004d9732:
  local_94 = XML_ERROR_NO_MEMORY;
  bVar30 = false;
LAB_004d9741:
  iVar15 = 1;
  if (bVar30) {
LAB_004d974f:
    local_7c = local_7c + -1;
    iVar15 = 0;
    if (local_7c == 0) {
      iVar15 = 0xe;
    }
  }
  if (iVar15 != 0) {
    if (iVar15 != 0xe) {
      return local_94;
    }
    goto LAB_004d977b;
  }
LAB_004d9764:
  uVar26 = uVar26 + 2;
  if (iVar12 <= (int)uVar26) goto LAB_004d977b;
  goto LAB_004d95d3;
}

Assistant:

static enum XML_Error storeAtts(XML_Parser parser, const ENCODING *enc,
                                const char *attStr, TAG_NAME *tagNamePtr,
                                BINDING **bindingsPtr)
{
  ELEMENT_TYPE *elementType = 0;
  int nDefaultAtts = 0;
  const XML_Char **appAtts;   /* the attribute list to pass to the application */
  int attIndex = 0;
  int i;
  int n;
  int nPrefixes = 0;
  BINDING *binding;
  const XML_Char *localPart;

  /* lookup the element type name */
  if (tagNamePtr) {
    elementType = (ELEMENT_TYPE *)lookup(&dtd.elementTypes, tagNamePtr->str,0);
    if (!elementType) {
      tagNamePtr->str = poolCopyString(&dtd.pool, tagNamePtr->str);
      if (!tagNamePtr->str)
        return XML_ERROR_NO_MEMORY;
      elementType = (ELEMENT_TYPE *)lookup(&dtd.elementTypes, tagNamePtr->str, sizeof(ELEMENT_TYPE));
      if (!elementType)
        return XML_ERROR_NO_MEMORY;
      if (ns && !setElementTypePrefix(parser, elementType))
        return XML_ERROR_NO_MEMORY;
    }
    nDefaultAtts = elementType->nDefaultAtts;
  }
  /* get the attributes from the tokenizer */
  n = XmlGetAttributes(enc, attStr, attsSize, atts);
  if (n + nDefaultAtts > attsSize) {
    int oldAttsSize = attsSize;
    attsSize = n + nDefaultAtts + INIT_ATTS_SIZE;
    atts = REALLOC((void *)atts, attsSize * sizeof(ATTRIBUTE));
    if (!atts)
      return XML_ERROR_NO_MEMORY;
    if (n > oldAttsSize)
      XmlGetAttributes(enc, attStr, n, atts);
  }
  appAtts = (const XML_Char **)atts;
  for (i = 0; i < n; i++) {
    /* add the name and value to the attribute list */
    ATTRIBUTE_ID *attId = getAttributeId(parser, enc, atts[i].name,
                                         atts[i].name
                                         + XmlNameLength(enc, atts[i].name));
    if (!attId)
      return XML_ERROR_NO_MEMORY;
    /* detect duplicate attributes */
    if ((attId->name)[-1]) {
      if (enc == encoding)
        eventPtr = atts[i].name;
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    (attId->name)[-1] = 1;
    appAtts[attIndex++] = attId->name;
    if (!atts[i].normalized) {
      enum XML_Error result;
      int isCdata = 1;

      /* figure out whether declared as other than CDATA */
      if (attId->maybeTokenized) {
        int j;
        for (j = 0; j < nDefaultAtts; j++) {
          if (attId == elementType->defaultAtts[j].id) {
            isCdata = elementType->defaultAtts[j].isCdata;
            break;
          }
        }
      }

      /* normalize the attribute value */
      result = storeAttributeValue(parser, enc, isCdata,
                                   atts[i].valuePtr, atts[i].valueEnd,
                                   &tempPool);
      if (result)
        return result;
      if (tagNamePtr) {
        appAtts[attIndex] = poolStart(&tempPool);
        poolFinish(&tempPool);
      }
      else
        poolDiscard(&tempPool);
    }
    else if (tagNamePtr) {
      /* the value did not need normalizing */
      appAtts[attIndex] = poolStoreString(&tempPool, enc, atts[i].valuePtr, atts[i].valueEnd);
      if (appAtts[attIndex] == 0)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&tempPool);
    }
    /* handle prefixed attribute names */
    if (attId->prefix && tagNamePtr) {
      if (attId->xmlns) {
        /* deal with namespace declarations here */
        if (!addBinding(parser, attId->prefix, attId, appAtts[attIndex], bindingsPtr))
          return XML_ERROR_NO_MEMORY;
        --attIndex;
      }
      else {
        /* deal with other prefixed names later */
        attIndex++;
        nPrefixes++;
        (attId->name)[-1] = 2;
      }
    }
    else
      attIndex++;
  }
  if (tagNamePtr) {
    int j;
    nSpecifiedAtts = attIndex;
    if (elementType->idAtt && (elementType->idAtt->name)[-1]) {
      for (i = 0; i < attIndex; i += 2)
        if (appAtts[i] == elementType->idAtt->name) {
          idAttIndex = i;
          break;
        }
    }
    else
      idAttIndex = -1;
    /* do attribute defaulting */
    for (j = 0; j < nDefaultAtts; j++) {
      const DEFAULT_ATTRIBUTE *da = elementType->defaultAtts + j;
      if (!(da->id->name)[-1] && da->value) {
        if (da->id->prefix) {
          if (da->id->xmlns) {
            if (!addBinding(parser, da->id->prefix, da->id, da->value, bindingsPtr))
              return XML_ERROR_NO_MEMORY;
          }
          else {
            (da->id->name)[-1] = 2;
            nPrefixes++;
            appAtts[attIndex++] = da->id->name;
            appAtts[attIndex++] = da->value;
          }
        }
        else {
          (da->id->name)[-1] = 1;
          appAtts[attIndex++] = da->id->name;
          appAtts[attIndex++] = da->value;
        }
      }
    }
    appAtts[attIndex] = 0;
  }
  i = 0;
  if (nPrefixes) {
    /* expand prefixed attribute names */
    for (; i < attIndex; i += 2) {
      if (appAtts[i][-1] == 2) {
        ATTRIBUTE_ID *id;
        ((XML_Char *)(appAtts[i]))[-1] = 0;
        id = (ATTRIBUTE_ID *)lookup(&dtd.attributeIds, appAtts[i], 0);
        if (id->prefix->binding) {
          int j;
          const BINDING *b = id->prefix->binding;
          const XML_Char *s = appAtts[i];
          for (j = 0; j < b->uriLen; j++) {
            if (!poolAppendChar(&tempPool, b->uri[j]))
              return XML_ERROR_NO_MEMORY;
          }
          while (*s++ != ':')
            ;
          do {
            if (!poolAppendChar(&tempPool, *s))
              return XML_ERROR_NO_MEMORY;
          } while (*s++);
          if (ns_triplets) {
            tempPool.ptr[-1] = namespaceSeparator;
            s = b->prefix->name;
            do {
              if (!poolAppendChar(&tempPool, *s))
                return XML_ERROR_NO_MEMORY;
            } while (*s++);
          }

          appAtts[i] = poolStart(&tempPool);
          poolFinish(&tempPool);
        }
        if (!--nPrefixes)
          break;
      }
      else
        ((XML_Char *)(appAtts[i]))[-1] = 0;
    }
  }
  /* clear the flags that say whether attributes were specified */
  for (; i < attIndex; i += 2)
    ((XML_Char *)(appAtts[i]))[-1] = 0;
  if (!tagNamePtr)
    return XML_ERROR_NONE;
  for (binding = *bindingsPtr; binding; binding = binding->nextTagBinding)
    binding->attId->name[-1] = 0;
  /* expand the element type name */
  if (elementType->prefix) {
    binding = elementType->prefix->binding;
    if (!binding)
      return XML_ERROR_NONE;
    localPart = tagNamePtr->str;
    while (*localPart++ != XML_T(':'))
      ;
  }
  else if (dtd.defaultPrefix.binding) {
    binding = dtd.defaultPrefix.binding;
    localPart = tagNamePtr->str;
  }
  else
    return XML_ERROR_NONE;
  tagNamePtr->localPart = localPart;
  tagNamePtr->uriLen = binding->uriLen;
  for (i = 0; localPart[i++];)
    ;
  n = i + binding->uriLen;
  if (n > binding->uriAlloc) {
    TAG *p;
    XML_Char *uri = MALLOC((n + EXPAND_SPARE) * sizeof(XML_Char));
    if (!uri)
      return XML_ERROR_NO_MEMORY;
    binding->uriAlloc = n + EXPAND_SPARE;
    memcpy(uri, binding->uri, binding->uriLen * sizeof(XML_Char));
    for (p = tagStack; p; p = p->parent)
      if (p->name.str == binding->uri)
        p->name.str = uri;
    FREE(binding->uri);
    binding->uri = uri;
  }
  memcpy(binding->uri + binding->uriLen, localPart, i * sizeof(XML_Char));
  tagNamePtr->str = binding->uri;
  return XML_ERROR_NONE;
}